

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_CheckPosition(AActor *thing,DVector2 *pos,FCheckPosition *tm,bool actorsonly)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  sector_t *psVar5;
  player_t *ppVar6;
  F3DFloor *pFVar7;
  secplane_t *psVar8;
  secplane_t *psVar9;
  AActor *pAVar10;
  sector_t *psVar11;
  bool bVar12;
  spechit_t *psVar13;
  undefined8 line;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  subsector_t *psVar18;
  extsector_t *peVar19;
  line_t *ld;
  byte bVar20;
  uint uVar21;
  byte bVar22;
  FBoundingBox *box;
  FMultiBlockThingsIterator *it_00;
  line_t *plVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  CheckResult lcres;
  double zofs;
  FBoundingBox pbox;
  spechit_t spec;
  DVector2 ref;
  FPortalGroupArray pcheck;
  DVector2 ref_1;
  FMultiBlockLinesIterator it;
  CheckResult tcres;
  FMultiBlockThingsIterator it2;
  AActor *local_460;
  undefined1 local_420 [16];
  sector_t *psStack_410;
  double dStack_408;
  uint local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  FBoundingBox local_3e0;
  FLineOpening local_3c0;
  line_t *local_330;
  DVector2 local_328;
  double dStack_318;
  uint local_310;
  undefined1 local_308 [48];
  double local_2d8;
  undefined8 uStack_2d0;
  FPortalGroupArray local_2c8;
  DVector2 local_2a0;
  FMultiBlockLinesIterator local_290;
  CheckResult local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  dVar29 = thing->Height;
  tm->thing = thing;
  dVar28 = pos->X;
  (tm->pos).X = dVar28;
  dVar2 = pos->Y;
  (tm->pos).Y = dVar2;
  (tm->pos).Z = (thing->__Pos).Z;
  psVar18 = P_PointInSubsector(dVar28,dVar2);
  psVar5 = psVar18->sector;
  tm->sector = psVar5;
  thing->BlockingLine = (line_t *)0x0;
  tm->ceilingline = (line_t *)0x0;
  ppVar6 = thing->player;
  if (((ppVar6 == (player_t *)0x0) || (ppVar6->mo != (APlayerPawn *)thing)) ||
     ((ppVar6->cheats & 0x40000000) == 0)) {
    if (((psVar5->planes[1].Flags & 0x1d0U) == 0x100) ||
       ((psVar5->planes[0].Flags & 0x1d0U) == 0x100)) {
      P_GetFloorCeilingZ(tm,2);
    }
    else {
      dVar28 = pos->X;
      dVar2 = pos->Y;
      dVar31 = ((psVar5->floorplane).normal.Y * dVar2 +
               (psVar5->floorplane).normal.X * dVar28 + (psVar5->floorplane).D) *
               (psVar5->floorplane).negiC;
      tm->dropoffz = dVar31;
      tm->floorz = dVar31;
      (tm->floorpic).texnum = psVar5->planes[0].Texture.texnum;
      tm->ceilingz = (dVar2 * (psVar5->ceilingplane).normal.Y +
                     dVar28 * (psVar5->ceilingplane).normal.X + (psVar5->ceilingplane).D) *
                     (psVar5->ceilingplane).negiC;
      (tm->ceilingpic).texnum = psVar5->planes[1].Texture.texnum;
      tm->ceilingsector = psVar5;
      tm->floorsector = psVar5;
      iVar17 = sector_t::GetTerrain(psVar5,0);
      tm->floorterrain = iVar17;
    }
    peVar19 = psVar5->e;
    if ((peVar19->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      dVar28 = thing->Height;
      uVar25 = -(ulong)(0.0 < dVar28);
      dVar2 = (thing->__Pos).Z;
      uVar24 = 0;
      do {
        pFVar7 = (peVar19->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar24];
        if ((~pFVar7->flags & 3) == 0) {
          psVar8 = (pFVar7->bottom).plane;
          psVar9 = (pFVar7->top).plane;
          dVar30 = ((psVar8->normal).Y * pos->Y + (psVar8->normal).X * pos->X + psVar8->D) *
                   psVar8->negiC;
          dVar26 = (pos->Y * (psVar9->normal).Y + pos->X * (psVar9->normal).X + psVar9->D) *
                   psVar9->negiC;
          dVar27 = (dVar26 - dVar30) * 0.5 + dVar30;
          dVar31 = (thing->__Pos).Z - dVar27;
          dVar27 = ((double)(~uVar25 & 0x3ff0000000000000 | (ulong)dVar28 & uVar25) + dVar2) -
                   dVar27;
          if ((tm->floorz <= dVar26 && dVar26 != tm->floorz) && (ABS(dVar31) < ABS(dVar27))) {
            tm->dropoffz = dVar26;
            tm->floorz = dVar26;
            (tm->floorpic).texnum = ((pFVar7->top).texture)->texnum;
            uStack_2d0 = 0;
            local_2d8 = dVar31;
            iVar17 = sector_t::GetTerrain(pFVar7->model,(pFVar7->top).isceiling);
            tm->floorterrain = iVar17;
            dVar31 = local_2d8;
          }
          if ((dVar30 < tm->ceilingz) && (ABS(dVar27) <= ABS(dVar31))) {
            tm->ceilingz = dVar30;
            (tm->ceilingpic).texnum = ((pFVar7->bottom).texture)->texnum;
          }
        }
        uVar24 = uVar24 + 1;
        peVar19 = psVar5->e;
      } while (uVar24 < (peVar19->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
  }
  else {
    dVar28 = sector_t::LowestFloorAt(psVar5,pos,&tm->floorsector);
    tm->dropoffz = dVar28;
    tm->floorz = dVar28;
    dVar28 = sector_t::HighestCeilingAt(psVar5,pos,&tm->ceilingsector);
    tm->ceilingz = dVar28;
    psVar11 = tm->floorsector;
    (tm->floorpic).texnum = psVar11->planes[0].Texture.texnum;
    iVar17 = sector_t::GetTerrain(psVar11,0);
    tm->floorterrain = iVar17;
    (tm->ceilingpic).texnum = tm->ceilingsector->planes[1].Texture.texnum;
  }
  tm->touchmidtex = false;
  tm->abovemidtex = false;
  validcount = validcount + 1;
  if (((thing->flags).Value & 0x1001000) == 0x1000) {
    return true;
  }
  thing->BlockingMobj = (AActor *)0x0;
  if (thing->player != (player_t *)0x0) {
    thing->Height = thing->MaxStepHeight + dVar29;
  }
  tm->stepthing = (AActor *)0x0;
  local_2c8.data.Array = (unsigned_short *)0x0;
  local_2c8.data.Most = 0;
  local_2c8.data.Count = 0;
  local_2c8.method = 1;
  local_2c8.varused = '\0';
  local_2c8.inited = false;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&local_1d0,&local_2c8,pos->X,pos->Y,(thing->__Pos).Z,thing->Height,thing->radius,false,
             psVar5);
  local_460 = (AActor *)0x0;
  do {
    do {
      it_00 = &local_1d0;
      bVar15 = FMultiBlockThingsIterator::Next(&local_1d0,&local_1f8);
      if (!bVar15) {
        validcount = validcount + 1;
        thing->BlockingMobj = (AActor *)0x0;
        thing->Height = dVar29;
        if ((actorsonly) || (((thing->flags).Value & 0x1000) != 0)) {
          thing->BlockingMobj = local_460;
          bVar15 = local_460 == (AActor *)0x0;
          goto LAB_0050ef6f;
        }
        if (spechit.Count != 0) {
          spechit.Count = 0;
        }
        if (portalhit.Count != 0) {
          portalhit.Count = 0;
        }
        FMultiBlockLinesIterator::FMultiBlockLinesIterator
                  (&local_290,&local_2c8,pos->X,pos->Y,(thing->__Pos).Z,dVar29,thing->radius,psVar5)
        ;
        local_2d8 = tm->floorz;
        tm->floorz = tm->dropoffz;
        bVar15 = true;
        goto LAB_0050e131;
      }
      bVar15 = PIT_CheckThing(it_00,&local_1f8,box,tm);
    } while (bVar15);
    pAVar10 = thing->BlockingMobj;
    if (((pAVar10 == (AActor *)0x0) || (((byte)i_compatflags & 0x10) != 0)) ||
       (((byte)local_1f8.portalflags & 0x80) != 0)) {
LAB_0050e029:
      thing->Height = dVar29;
      bVar15 = false;
    }
    else {
      if (((pAVar10->player != (player_t *)0x0) || (((thing->flags).Value & 0x1014000) != 0)) ||
         (dVar28 = (pAVar10->__Pos).Z,
         thing->MaxStepHeight < (pAVar10->Height + dVar28) - (thing->__Pos).Z)) {
        if (((thing->player == (player_t *)0x0) ||
            (thing->MaxStepHeight < ((thing->__Pos).Z + thing->Height) - (pAVar10->__Pos).Z)) ||
           (local_460 != (AActor *)0x0)) goto LAB_0050e029;
        local_460 = (AActor *)0x0;
      }
      else if ((local_460 == (AActor *)0x0) ||
              (pdVar1 = &(local_460->__Pos).Z, *pdVar1 <= dVar28 && dVar28 != *pdVar1)) {
        local_460 = pAVar10;
      }
      thing->BlockingMobj = (AActor *)0x0;
      bVar15 = true;
    }
  } while (bVar15);
  goto LAB_0050f025;
LAB_0050e131:
  bVar16 = FMultiBlockLinesIterator::Next(&local_290,(CheckResult *)local_420);
  line = local_420._0_8_;
  if (bVar16) {
    bVar16 = true;
    if ((((local_290.bbox.m_Box[2] < ((double *)(local_420._0_8_ + 0x58))[3]) &&
         (((double *)(local_420._0_8_ + 0x58))[2] <= local_290.bbox.m_Box[3] &&
          local_290.bbox.m_Box[3] != ((double *)(local_420._0_8_ + 0x58))[2])) &&
        (((double *)(local_420._0_8_ + 0x58))[1] <= local_290.bbox.m_Box[0] &&
         local_290.bbox.m_Box[0] != ((double *)(local_420._0_8_ + 0x58))[1])) &&
       ((local_290.bbox.m_Box[1] < *(double *)(local_420._0_8_ + 0x58) &&
        (iVar17 = FBoundingBox::BoxOnLineSide(&local_290.bbox,(line_t *)local_420._0_8_),
        iVar17 == -1)))) {
      if (*(sector_t **)(line + 0x80) == (sector_t *)0x0) {
        if (((*(uint *)(local_420._0_8_ + 0x90) < linePortals.Count) &&
            ((linePortals.Array[*(uint *)(local_420._0_8_ + 0x90)].mFlags & 2) != 0)) &&
           (((*(side_t **)(local_420._0_8_ + 0x48))->Flags & 0x40) != 0)) {
          local_3c0.top = (double)line;
          local_3c0.lowfloor = (double)local_420._8_8_;
          local_3c0.bottomsec = psStack_410;
          AActor::PosRelative((DVector3 *)local_308,tm->thing,(line_t *)line);
          local_3c0.bottom = (double)local_308._0_8_;
          local_3c0.range = (double)local_308._8_8_;
          TArray<spechit_t,_spechit_t>::Push(&portalhit,(spechit_t *)&local_3c0);
        }
        else if ((((local_400 & 0x20) == 0) ||
                 ((((*(sector_t **)(local_420._0_8_ + 0x78))->planes[0].Flags & 0x1d0U) == 0x100 &&
                  (sectorPortals.Array[(*(sector_t **)(local_420._0_8_ + 0x78))->Portals[0]].mPlaneZ
                   < (tm->thing->__Pos).Z + tm->thing->Height)))) &&
                (((local_400 & 0x40) == 0 ||
                 ((((*(sector_t **)(local_420._0_8_ + 0x78))->planes[1].Flags & 0x1d0U) == 0x100 &&
                  ((tm->thing->__Pos).Z <
                   sectorPortals.Array[(*(sector_t **)(local_420._0_8_ + 0x78))->Portals[1]].mPlaneZ
                  )))))) {
          psVar5 = *(sector_t **)(local_420._0_8_ + 0x78);
          if ((psVar5->planes[1].Flags & 0x1d0U) == 0x100) {
            dVar29 = sectorPortals.Array[psVar5->Portals[1]].mPlaneZ;
            dVar28 = (tm->thing->__Pos).Z;
            if (((dVar28 < dVar29) && (dVar29 <= dVar28 + tm->thing->MaxStepHeight)) &&
               (tm->floorz <= dVar29 && dVar29 != tm->floorz)) {
              tm->floorz = dVar29;
              tm->floorsector = psVar5;
              (tm->floorpic).texnum =
                   (*(side_t **)(local_420._0_8_ + 0x48))->textures[1].texture.texnum;
              tm->floorterrain = 0;
              tm->portalstep = true;
              goto LAB_0050e1b2;
            }
          }
          pAVar10 = tm->thing;
          if (((pAVar10->flags2).Value & 8) != 0) {
            local_308._0_4_ = 0x84;
            local_3c0.top = 0.0;
            P_DamageMobj(pAVar10,(AActor *)0x0,(AActor *)0x0,pAVar10->Mass >> 5,(FName *)local_308,0
                         ,(DAngle *)&local_3c0);
          }
          pAVar10 = tm->thing;
          pAVar10->BlockingLine = (line_t *)line;
          bVar16 = false;
          CheckForPushSpecial((line_t *)line,0,pAVar10,(DVector2 *)0x0);
        }
      }
      else {
        pAVar10 = tm->thing;
        uVar21 = (pAVar10->flags).Value;
        bVar22 = 1;
        bVar20 = 1;
        if ((uVar21 >> 0x10 & 1) == 0) {
          bVar20 = (*(byte *)((long)&(pAVar10->BounceFlags).Value + 1) & 0x10) >> 4;
        }
        if (((pAVar10->flags3).Value & 0x100000) == 0) {
          if ((i_compatflags._3_1_ & 4) == 0) {
            bVar22 = 0;
          }
          else {
            bVar22 = (byte)(uVar21 >> 0x1b) & 1;
          }
        }
        if ((bVar20 == 0) || ((*(DWORD *)(line + 0x20) & 0x1008000) != 0)) {
          uVar3 = *(DWORD *)(line + 0x20);
          bVar16 = true;
          if (((uVar3 >> 0x11 & 1) != 0) ||
             ((((((uVar3 & 0x8001) == 0 && ((byte)(~bVar22 & (byte)((uVar3 & 2) >> 1)) == 0)) &&
                (((uVar3 >> 0xe & 1) == 0 || (pAVar10->player == (player_t *)0x0)))) &&
               ((bVar20 & (byte)(uVar3 >> 0x18) & 1) == 0)) &&
              ((bVar16 = false, (uVar21 >> 0xe & 1) == 0 || ((uVar3 & 0x40000) == 0))))))
          goto LAB_0050e767;
          if ((local_400 & 0x20) != 0) {
            psVar5 = *(sector_t **)(local_420._0_8_ + 0x78);
            uVar21 = 0xffffffff;
            if ((psVar5->planes[0].Flags & 0x1d0U) == 0x100) {
              uVar21 = (uint)((pAVar10->__Pos).Z + pAVar10->Height <=
                             sectorPortals.Array[psVar5->Portals[0]].mPlaneZ);
            }
            bVar16 = true;
            if (uVar21 != 0xffffffff) {
              if (uVar21 != 1) goto LAB_0050e765;
              if (sectorPortals.Array[psVar5->Portals[0]].mPlaneZ < tm->ceilingz) {
                tm->ceilingz = sectorPortals.Array[psVar5->Portals[0]].mPlaneZ;
                tm->ceilingsector = psVar5;
              }
            }
            goto LAB_0050e1b2;
          }
          if ((local_400 & 0x40) != 0) {
            psVar5 = *(sector_t **)(local_420._0_8_ + 0x78);
            uVar21 = 0xffffffff;
            if ((psVar5->planes[1].Flags & 0x1d0U) == 0x100) {
              uVar21 = (uint)(sectorPortals.Array[psVar5->Portals[1]].mPlaneZ <= (pAVar10->__Pos).Z)
              ;
            }
            bVar16 = true;
            if (uVar21 != 0xffffffff) {
              if (uVar21 != 1) goto LAB_0050e765;
              dVar29 = sectorPortals.Array[psVar5->Portals[1]].mPlaneZ;
              if (tm->floorz <= dVar29 && dVar29 != tm->floorz) {
                tm->floorz = dVar29;
                tm->floorsector = psVar5;
                tm->floorterrain = 0;
              }
            }
            goto LAB_0050e1b2;
          }
          if (((pAVar10->flags2).Value & 8) != 0) {
            local_3e0.m_Box[0] = (double)CONCAT44(local_3e0.m_Box[0]._4_4_,0x84);
            local_308._0_8_ = (sector_t *)0x0;
            P_DamageMobj(pAVar10,(AActor *)0x0,(AActor *)0x0,pAVar10->Mass >> 5,(FName *)&local_3e0,
                         0,(DAngle *)local_308);
          }
          tm->thing->BlockingLine = (line_t *)line;
          local_3c0.top = (double)local_420._8_8_;
          local_3c0.bottom = (double)psStack_410;
          iVar17 = P_PointOnLineSide((DVector2 *)&local_3c0,(line_t *)line);
          CheckForPushSpecial((line_t *)line,iVar17,tm->thing,(DVector2 *)0x0);
        }
        else {
LAB_0050e765:
          bVar16 = false;
LAB_0050e767:
          local_3c0.top = (double)local_420._8_8_;
          local_3c0.bottom = (double)psStack_410;
          FindRefPoint((line_t *)line,(DVector2 *)&local_3c0);
          P_LineOpening(&local_3c0,pAVar10,(line_t *)line,(DVector2 *)local_308,
                        (DVector2 *)(local_420 + 8),local_400);
          psVar5 = psStack_410;
          uVar14 = local_420._8_8_;
          pAVar10 = tm->thing;
          if ((((pAVar10->flags).Value & 0x1600) != 0) ||
             (local_3c0.frontfloorplane.normal.Z < 0.707122802734375 !=
              0.707122802734375 <= local_3c0.backfloorplane.normal.Z)) {
            if ((local_3c0.frontfloorplane.normal.X != local_3c0.backfloorplane.normal.X) ||
               (NAN(local_3c0.frontfloorplane.normal.X) || NAN(local_3c0.backfloorplane.normal.X)))
            {
              bVar12 = false;
            }
            else if ((local_3c0.frontfloorplane.normal.Y != local_3c0.backfloorplane.normal.Y) ||
                    (NAN(local_3c0.frontfloorplane.normal.Y) ||
                     NAN(local_3c0.backfloorplane.normal.Y))) {
              bVar12 = false;
            }
            else {
              bVar12 = local_3c0.backfloorplane.normal.Z == local_3c0.frontfloorplane.normal.Z;
            }
            if (bVar12) {
              if (((local_3c0.frontfloorplane.D == local_3c0.backfloorplane.D) &&
                  (!NAN(local_3c0.frontfloorplane.D) && !NAN(local_3c0.backfloorplane.D))) &&
                 (-3.4028234663852886e+38 < local_3c0.bottom)) {
                local_3c0.bottom =
                     ((double)psStack_410 * local_3c0.frontfloorplane.normal.Y +
                     local_3c0.frontfloorplane.D +
                     local_3c0.frontfloorplane.normal.X * (double)local_420._8_8_) *
                     local_3c0.frontfloorplane.negiC;
              }
            }
            if (bVar16) {
              if ((level.flags2._2_1_ & 0x20) != 0) {
                psVar11 = pAVar10->Sector;
                dVar29 = ((psVar11->floorplane).normal.Y * (double)local_308._8_8_ +
                         (psVar11->floorplane).normal.X * (double)local_308._0_8_ +
                         (psVar11->floorplane).D) * (psVar11->floorplane).negiC;
                if ((local_3c0.bottom != dVar29) || (NAN(local_3c0.bottom) || NAN(dVar29)))
                goto LAB_0050e921;
              }
              local_3c0.bottom = local_3c0.bottom + 32.0;
            }
LAB_0050e921:
            if (((local_400 & 0x40) == 0) && (local_3c0.top < tm->ceilingz)) {
              tm->ceilingz = local_3c0.top;
              tm->ceilingsector = local_3c0.topsec;
              (tm->ceilingpic).texnum = local_3c0.ceilingpic.texnum;
              tm->ceilingline = (line_t *)line;
              pAVar10->BlockingLine = (line_t *)line;
            }
            if ((local_400 & 0x20) == 0) {
              pdVar1 = &tm->floorz;
              if (local_3c0.bottom < *pdVar1 || local_3c0.bottom == *pdVar1) {
                if ((local_3c0.bottom == *pdVar1) && (!NAN(local_3c0.bottom) && !NAN(*pdVar1))) {
                  tm->touchmidtex = (bool)(tm->touchmidtex | local_3c0.touchmidtex);
                  tm->abovemidtex = (bool)(tm->abovemidtex | local_3c0.abovemidtex);
                }
              }
              else {
                tm->floorz = local_3c0.bottom;
                tm->floorsector = local_3c0.bottomsec;
                (tm->floorpic).texnum = local_3c0.floorpic.texnum;
                tm->floorterrain = local_3c0.floorterrain;
                tm->touchmidtex = local_3c0.touchmidtex;
                tm->abovemidtex = local_3c0.abovemidtex;
                pAVar10->BlockingLine = (line_t *)line;
              }
              if (local_3c0.lowfloor < tm->dropoffz) {
                tm->dropoffz = local_3c0.lowfloor;
              }
            }
            if (*(int *)(line + 0x28) != 0) {
              iVar17 = pAVar10->Sector->PortalGroup;
              iVar4 = (*(sector_t **)(line + 0x78))->PortalGroup;
              dVar29 = 0.0;
              dVar28 = 0.0;
              if (iVar17 != iVar4) {
                iVar17 = iVar4 * Displacements.size + iVar17;
                dVar29 = Displacements.data.Array[iVar17].pos.X;
                dVar28 = Displacements.data.Array[iVar17].pos.Y;
              }
              local_3f0 = (pAVar10->__Pos).X;
              local_3e8 = (pAVar10->__Pos).Y;
              TArray<spechit_t,_spechit_t>::Grow(&spechit,1);
              psVar13 = spechit.Array;
              uVar24 = (ulong)spechit.Count;
              spechit.Array[uVar24].line = (line_t *)line;
              psVar13[uVar24].Oldrefpos.X = local_3f0 + dVar29;
              psVar13[uVar24].Oldrefpos.Y = local_3e8 + dVar28;
              psVar13[uVar24].Refpos.X = (double)uVar14;
              psVar13[uVar24].Refpos.Y = (double)psVar5;
              spechit.Count = spechit.Count + 1;
            }
            psVar5 = psStack_410;
            uVar14 = local_420._8_8_;
            bVar16 = true;
            if ((*(uint *)(line + 0x90) < linePortals.Count) &&
               ((linePortals.Array[*(uint *)(line + 0x90)].mFlags & 2) != 0)) {
              pAVar10 = tm->thing;
              iVar17 = pAVar10->Sector->PortalGroup;
              iVar4 = (*(sector_t **)(line + 0x78))->PortalGroup;
              dVar29 = 0.0;
              dVar28 = 0.0;
              if (iVar17 != iVar4) {
                iVar17 = iVar4 * Displacements.size + iVar17;
                dVar29 = Displacements.data.Array[iVar17].pos.X;
                dVar28 = Displacements.data.Array[iVar17].pos.Y;
              }
              local_3f0 = (pAVar10->__Pos).X;
              local_3e8 = (pAVar10->__Pos).Y;
              TArray<spechit_t,_spechit_t>::Grow(&portalhit,1);
              psVar13 = portalhit.Array;
              uVar24 = (ulong)portalhit.Count;
              portalhit.Array[uVar24].line = (line_t *)line;
              psVar13[uVar24].Oldrefpos.X = local_3f0 + dVar29;
              psVar13[uVar24].Oldrefpos.Y = local_3e8 + dVar28;
              psVar13[uVar24].Refpos.X = (double)uVar14;
              psVar13[uVar24].Refpos.Y = (double)psVar5;
              portalhit.Count = portalhit.Count + 1;
            }
            goto LAB_0050e1b2;
          }
        }
        bVar16 = false;
      }
    }
LAB_0050e1b2:
    bVar15 = (bool)(bVar15 & bVar16);
    if (bVar16) {
      uVar21 = *(uint *)(local_420._0_8_ + 0x90);
      if (((linePortals.Array != (FLinePortal *)0x0 && uVar21 < linePortals.Count) &&
          ((linePortals.Array[uVar21].mFlags & 2) != 0)) &&
         (linePortals.Array[uVar21].mType != '\x03')) {
        local_330 = (line_t *)local_420._0_8_;
        local_328.X = (double)local_420._8_8_;
        local_328.Y = (double)psStack_410;
        dStack_318 = dStack_408;
        local_310 = local_400;
        if (((((local_400 & 0x60) == 0) &&
             (local_290.bbox.m_Box[2] < ((double *)(local_420._0_8_ + 0x58))[3])) &&
            ((((double *)(local_420._0_8_ + 0x58))[2] <= local_290.bbox.m_Box[3] &&
              local_290.bbox.m_Box[3] != ((double *)(local_420._0_8_ + 0x58))[2] &&
             ((((double *)(local_420._0_8_ + 0x58))[1] <= local_290.bbox.m_Box[0] &&
               local_290.bbox.m_Box[0] != ((double *)(local_420._0_8_ + 0x58))[1] &&
              (local_290.bbox.m_Box[1] < *(double *)(local_420._0_8_ + 0x58))))))) &&
           (iVar17 = FBoundingBox::BoxOnLineSide(&local_290.bbox,(line_t *)local_420._0_8_),
           iVar17 == -1)) {
          if (local_330->portalindex < linePortals.Count) {
            plVar23 = linePortals.Array[local_330->portalindex].mDestination;
          }
          else {
            plVar23 = (line_t *)0x0;
          }
          local_3f8 = 0.0;
          P_TranslatePortalXY(local_330,&local_328.X,&local_328.Y);
          P_TranslatePortalZ(local_330,&local_3f8);
          psVar5 = plVar23->backsector;
          if (psVar5 == (sector_t *)0x0) {
            plVar23->backsector = plVar23->frontsector;
          }
          pAVar10 = tm->thing;
          (pAVar10->__Pos).Z = local_3f8 + (pAVar10->__Pos).Z;
          local_3e0.m_Box[1] = pAVar10->radius;
          local_3e0.m_Box[0] = local_328.Y + local_3e0.m_Box[1];
          local_3e0.m_Box[2] = local_328.X - local_3e0.m_Box[1];
          local_3e0.m_Box[3] = local_328.X + local_3e0.m_Box[1];
          local_3e0.m_Box[1] = local_328.Y - local_3e0.m_Box[1];
          FBlockLinesIterator::FBlockLinesIterator((FBlockLinesIterator *)local_308,&local_3e0);
          ld = FBlockLinesIterator::Next((FBlockLinesIterator *)local_308);
          if (ld == (line_t *)0x0) {
            bVar16 = false;
          }
          else {
            bVar16 = false;
            do {
              while (((((ld->bbox[3] <= local_3e0.m_Box[2] ||
                        (local_3e0.m_Box[3] < ld->bbox[2] || local_3e0.m_Box[3] == ld->bbox[2])) ||
                       (local_3e0.m_Box[0] < ld->bbox[1] || local_3e0.m_Box[0] == ld->bbox[1])) ||
                      ((ld->bbox[0] <= local_3e0.m_Box[1] ||
                       (iVar17 = FBoundingBox::BoxOnLineSide(&local_3e0,ld), iVar17 != -1)))) ||
                     (ld->backsector == (sector_t *)0x0))) {
                ld = FBlockLinesIterator::Next((FBlockLinesIterator *)local_308);
                if (ld == (line_t *)0x0) goto LAB_0050ef12;
              }
              local_3c0.top = local_328.X;
              local_3c0.bottom = local_328.Y;
              FindRefPoint(ld,(DVector2 *)&local_3c0);
              P_LineOpening(&local_3c0,tm->thing,ld,&local_2a0,&local_328,0);
              if (local_3c0.top - local_3f8 < tm->ceilingz) {
                tm->ceilingz = local_3c0.top - local_3f8;
                (tm->ceilingpic).texnum = local_3c0.ceilingpic.texnum;
                bVar16 = true;
              }
              dVar29 = local_3c0.bottom - local_3f8;
              if (tm->floorz <= dVar29 && dVar29 != tm->floorz) {
                tm->floorz = dVar29;
                (tm->floorpic).texnum = local_3c0.floorpic.texnum;
                tm->floorterrain = local_3c0.floorterrain;
                bVar16 = true;
              }
              if (local_3c0.lowfloor - local_3f8 < tm->dropoffz) {
                tm->dropoffz = local_3c0.lowfloor - local_3f8;
              }
              ld = FBlockLinesIterator::Next((FBlockLinesIterator *)local_308);
            } while (ld != (line_t *)0x0);
          }
LAB_0050ef12:
          (tm->thing->__Pos).Z = (tm->thing->__Pos).Z - local_3f8;
          plVar23->backsector = psVar5;
          if (bVar16) {
            tm->thing->BlockingLine = (line_t *)local_420._0_8_;
          }
        }
      }
    }
    goto LAB_0050e131;
  }
  if (bVar15) {
    if (thing->Height <= tm->ceilingz - tm->floorz) {
      dVar29 = tm->floorz;
      if ((tm->touchmidtex != false) || (dVar29 = local_2d8, tm->stepthing != (AActor *)0x0)) {
        tm->dropoffz = dVar29;
      }
      thing->BlockingMobj = local_460;
      bVar15 = local_460 == (AActor *)0x0;
    }
    else {
      bVar15 = false;
    }
    goto LAB_0050ef6f;
  }
LAB_0050f025:
  bVar15 = false;
LAB_0050ef6f:
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
            (&local_1d0.blockIterator.DynHash);
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_2c8.data);
  return bVar15;
}

Assistant:

bool P_CheckPosition(AActor *thing, const DVector2 &pos, FCheckPosition &tm, bool actorsonly)
{
	sector_t *newsec;
	AActor *thingblocker;
	double realHeight = thing->Height;

	tm.thing = thing;

	tm.pos.X = pos.X;
	tm.pos.Y = pos.Y;
	tm.pos.Z = thing->Z();

	newsec = tm.sector = P_PointInSector(pos);
	tm.ceilingline = thing->BlockingLine = NULL;

	// Retrieve the base floor / ceiling from the target location.
	// Any contacted lines the step closer together will adjust them.
	if (!thing->IsNoClip2())
	{
		if (!newsec->PortalBlocksMovement(sector_t::ceiling) || !newsec->PortalBlocksMovement(sector_t::floor))
		{
			// Use P_GetFloorCeilingZ only if there's portals to consider. Its logic is subtly different than what is needed here for 3D floors.
			P_GetFloorCeilingZ(tm, FFCF_SAMESECTOR);
		}
		else
		{
			tm.floorz = tm.dropoffz = newsec->floorplane.ZatPoint(pos);
			tm.floorpic = newsec->GetTexture(sector_t::floor);
			tm.ceilingz = newsec->ceilingplane.ZatPoint(pos);
			tm.ceilingpic = newsec->GetTexture(sector_t::ceiling);
			tm.floorsector = tm.ceilingsector = newsec;
			tm.floorterrain = newsec->GetTerrain(sector_t::floor);
		}

		F3DFloor*  rover;
		double thingtop = thing->Height > 0 ? thing->Top() : thing->Z() + 1;

		for (unsigned i = 0; i<newsec->e->XFloor.ffloors.Size(); i++)
		{
			rover = newsec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(pos);
			double ff_top = rover->top.plane->ZatPoint(pos);

			double delta1 = thing->Z() - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = thingtop - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_top > tm.floorz && fabs(delta1) < fabs(delta2))
			{
				tm.floorz = tm.dropoffz = ff_top;
				tm.floorpic = *rover->top.texture;
				tm.floorterrain = rover->model->GetTerrain(rover->top.isceiling);
			}
			if (ff_bottom < tm.ceilingz && fabs(delta1) >= fabs(delta2))
			{
				tm.ceilingz = ff_bottom;
				tm.ceilingpic = *rover->bottom.texture;
			}
		}
	}
	else
	{
		// With noclip2, we must ignore 3D floors and go right to the uppermost ceiling and lowermost floor.
		tm.floorz = tm.dropoffz = newsec->LowestFloorAt(pos, &tm.floorsector);
		tm.ceilingz = newsec->HighestCeilingAt(pos, &tm.ceilingsector);
		tm.floorpic = tm.floorsector->GetTexture(sector_t::floor);
		tm.floorterrain = tm.floorsector->GetTerrain(sector_t::floor);
		tm.ceilingpic = tm.ceilingsector->GetTexture(sector_t::ceiling);
	}

	tm.touchmidtex = false;
	tm.abovemidtex = false;
	validcount++;

	if ((thing->flags & MF_NOCLIP) && !(thing->flags & MF_SKULLFLY))
		return true;

	// Check things first, possibly picking things up.
	thing->BlockingMobj = NULL;
	thingblocker = NULL;
	if (thing->player)
	{ // [RH] Fake taller height to catch stepping up into things.
		thing->Height = realHeight + thing->MaxStepHeight;
	}

	tm.stepthing = NULL;
	FBoundingBox box(pos.X, pos.Y, thing->radius);

	FPortalGroupArray pcheck;
	FMultiBlockThingsIterator it2(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, false, newsec);
	FMultiBlockThingsIterator::CheckResult tcres;

	while ((it2.Next(&tcres)))
	{
		if (!PIT_CheckThing(it2, tcres, it2.Box(), tm))
		{ // [RH] If a thing can be stepped up on, we need to continue checking
			// other things in the blocks and see if we hit something that is
			// definitely blocking. Otherwise, we need to check the lines, or we
			// could end up stuck inside a wall.
			AActor *BlockingMobj = thing->BlockingMobj;

			// If this blocks through a restricted line portal, it will always completely block.
			if (BlockingMobj == NULL || (i_compatflags & COMPATF_NO_PASSMOBJ) || (tcres.portalflags & FFCF_RESTRICTEDPORTAL))
			{ // Thing slammed into something; don't let it move now.
				thing->Height = realHeight;
				return false;
			}
			else if (!BlockingMobj->player && !(thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY)) &&
				BlockingMobj->Top() - thing->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker == NULL ||
					BlockingMobj->Z() > thingblocker->Z())
				{
					thingblocker = BlockingMobj;
				}
				thing->BlockingMobj = NULL;
			}
			else if (thing->player &&
				thing->Top() - BlockingMobj->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker)
				{ // There is something to step up on. Return this thing as
					// the blocker so that we don't step up.
					thing->Height = realHeight;
					return false;
				}
				// Nothing is blocking us, but this actor potentially could
				// if there is something else to step on.
				thing->BlockingMobj = NULL;
			}
			else
			{ // Definitely blocking
				thing->Height = realHeight;
				return false;
			}
		}
	}

	// check lines

	// [RH] We need to increment validcount again, because a function above may
	// have already set some lines to equal the current validcount.
	//
	// Specifically, when DehackedPickup spawns a new item in its TryPickup()
	// function, that new actor will set the lines around it to match validcount
	// when it links itself into the world. If we just leave validcount alone,
	// that will give the player the freedom to walk through walls at will near
	// a pickup they cannot get, because their validcount will prevent them from
	// being considered for collision with the player.
	validcount++;

	thing->BlockingMobj = NULL;
	thing->Height = realHeight;
	if (actorsonly || (thing->flags & MF_NOCLIP))
		return (thing->BlockingMobj = thingblocker) == NULL;

	spechit.Clear();
	portalhit.Clear();

	FMultiBlockLinesIterator it(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, newsec);
	FMultiBlockLinesIterator::CheckResult lcres;

	double thingdropoffz = tm.floorz;
	//bool onthing = (thingdropoffz != tmdropoffz);
	tm.floorz = tm.dropoffz;

	bool good = true;

	while (it.Next(&lcres))
	{
		bool thisresult = PIT_CheckLine(it, lcres, it.Box(), tm);
		good &= thisresult;
		if (thisresult)
		{
			FLinePortal *port = lcres.line->getPortal();
			if (port != NULL && port->mFlags & PORTF_PASSABLE && port->mType != PORTT_LINKED)
			{
				// Checking the other side of the portal completely is too costly,
				// but checking the portal's destination line is necessary to 
				// retrieve the proper sector heights on the other side.
				if (PIT_CheckPortal(it, lcres, it.Box(), tm))
				{
					tm.thing->BlockingLine = lcres.line;
				}
			}
		}
	}
	if (!good)
	{
		return false;
	}
	if (tm.ceilingz - tm.floorz < thing->Height)
	{
		return false;
	}
	if (tm.touchmidtex)
	{
		tm.dropoffz = tm.floorz;
	}
	else if (tm.stepthing != NULL)
	{
		tm.dropoffz = thingdropoffz;
	}

	return (thing->BlockingMobj = thingblocker) == NULL;
}